

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMarshall.c
# Opt level: O1

JL_STATUS MarshallObject(void *Input,JlMarshallElement *Description,JlDataObject **pNewObject)

{
  JL_NUM_TYPE JVar1;
  bool bVar2;
  JL_STATUS JVar3;
  size_t sVar4;
  ulong NumberU64;
  uint8_t *InputU8;
  long NumberS64;
  bool bVar5;
  double NumberF64;
  
  *pNewObject = (JlDataObject *)0x0;
  JVar3 = JL_STATUS_INVALID_TYPE;
  switch(Description->Type) {
  case JL_DATA_TYPE_STRING:
    if (Description->FieldSize == 0) {
      Input = *Input;
      JVar3 = JL_STATUS_SUCCESS;
      bVar5 = true;
    }
    else {
      JVar3 = JL_STATUS_SUCCESS;
      sVar4 = 0;
      do {
        bVar5 = *(char *)((long)Input + sVar4) == '\0';
        if (bVar5) goto LAB_001058fc;
        sVar4 = sVar4 + 1;
      } while (Description->FieldSize != sVar4);
      JVar3 = JL_STATUS_STRING_NOT_TERMINATED;
      bVar5 = false;
    }
LAB_001058fc:
    if ((bVar5) &&
       (JVar3 = JlCreateObject(JL_DATA_TYPE_STRING,pNewObject),
       (char *)Input != (char *)0x0 && JVar3 == JL_STATUS_SUCCESS)) {
      JVar3 = JlSetObjectString(*pNewObject,(char *)Input);
      return JVar3;
    }
    break;
  case JL_DATA_TYPE_NUMBER:
    JVar1 = Description->NumberType;
    if (JVar1 == JL_NUM_TYPE_FLOAT) {
      if (Description->FieldSize == 4) {
        NumberF64 = (double)*Input;
      }
      else {
        if (Description->FieldSize != 8) {
          JVar3 = JL_STATUS_INVALID_SPECIFICATION;
          NumberF64 = 0.0;
          bVar5 = false;
          goto LAB_001059f2;
        }
        NumberF64 = *Input;
      }
      JVar3 = JL_STATUS_SUCCESS;
      bVar5 = true;
LAB_001059f2:
      if (!bVar5) {
        return JVar3;
      }
      JVar3 = JlCreateObject(JL_DATA_TYPE_NUMBER,pNewObject);
      if (JVar3 != JL_STATUS_SUCCESS) {
        return JVar3;
      }
      JVar3 = JlSetObjectNumberF64(*pNewObject,NumberF64);
      return JVar3;
    }
    if (JVar1 != JL_NUM_TYPE_SIGNED) {
      if (JVar1 != JL_NUM_TYPE_UNSIGNED) {
        return JL_STATUS_INVALID_TYPE;
      }
      JVar3 = JL_STATUS_INVALID_SPECIFICATION;
      NumberU64 = 0;
      bVar5 = false;
      switch(Description->FieldSize) {
      case 1:
        NumberU64 = (ulong)*Input;
        break;
      case 2:
        NumberU64 = (ulong)*Input;
        break;
      default:
        goto switchD_001058b6_caseD_3;
      case 4:
        NumberU64 = (ulong)*Input;
        break;
      case 8:
        NumberU64 = *Input;
      }
      JVar3 = JL_STATUS_SUCCESS;
      bVar5 = true;
switchD_001058b6_caseD_3:
      if (!bVar5) {
        return JVar3;
      }
      JVar3 = JlCreateObject(JL_DATA_TYPE_NUMBER,pNewObject);
      if (JVar3 != JL_STATUS_SUCCESS) {
        return JVar3;
      }
      if (Description->IsHex != true) {
        JVar3 = JlSetObjectNumberU64(*pNewObject,NumberU64);
        return JVar3;
      }
      JVar3 = JlSetObjectNumberHex(*pNewObject,NumberU64);
      return JVar3;
    }
    JVar3 = JL_STATUS_INVALID_SPECIFICATION;
    NumberS64 = 0;
    bVar5 = false;
    switch(Description->FieldSize) {
    case 1:
      NumberS64 = (long)*Input;
      break;
    case 2:
      NumberS64 = (long)*Input;
      break;
    default:
      goto switchD_00105967_caseD_3;
    case 4:
      NumberS64 = (long)*Input;
      break;
    case 8:
      NumberS64 = *Input;
    }
    JVar3 = JL_STATUS_SUCCESS;
    bVar5 = true;
switchD_00105967_caseD_3:
    if ((bVar5) &&
       (JVar3 = JlCreateObject(JL_DATA_TYPE_NUMBER,pNewObject), JVar3 == JL_STATUS_SUCCESS)) {
      JVar3 = JlSetObjectNumberS64(*pNewObject,NumberS64);
      return JVar3;
    }
    break;
  case JL_DATA_TYPE_BOOL:
    JVar3 = JL_STATUS_INVALID_SPECIFICATION;
    bVar2 = false;
    bVar5 = false;
    switch(Description->FieldSize) {
    case 1:
      bVar5 = *Input == '\0';
      break;
    case 2:
      bVar5 = *Input == 0;
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      goto switchD_00105863_caseD_3;
    case 4:
      bVar5 = *Input == 0;
      break;
    case 8:
      bVar5 = *Input == 0;
      break;
    default:
      bVar2 = false;
      bVar5 = false;
      goto switchD_00105863_caseD_3;
    }
    bVar5 = !bVar5;
    JVar3 = JL_STATUS_SUCCESS;
    bVar2 = true;
switchD_00105863_caseD_3:
    if ((bVar2) &&
       (JVar3 = JlCreateObject(JL_DATA_TYPE_BOOL,pNewObject), JVar3 == JL_STATUS_SUCCESS)) {
      JVar3 = JlSetObjectBool(*pNewObject,bVar5);
      return JVar3;
    }
    break;
  case JL_DATA_TYPE_DICTIONARY:
    JVar3 = JlCreateObject(JL_DATA_TYPE_DICTIONARY,pNewObject);
    if (JVar3 == JL_STATUS_SUCCESS) {
      JVar3 = MarshallDictionary(Input,Description->ChildStructDescription,
                                 (ulong)Description->ChildStructDescriptionCount,*pNewObject);
      return JVar3;
    }
  }
  return JVar3;
}

Assistant:

static
JL_STATUS
    MarshallObject
    (
        void const*                 Input,
        JlMarshallElement const*    Description,
        JlDataObject**              pNewObject
    )
{
    JL_STATUS jlStatus;

    *pNewObject = NULL;

    if( JL_DATA_TYPE_STRING == Description->Type )
    {
        // Regular allocated string.
        // Input is a pointer to a string.
        jlStatus = MarshallString( Input, Description, pNewObject );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type )
    {
        jlStatus = MarshallNumber( Input, Description, pNewObject );
    }
    else if( JL_DATA_TYPE_BOOL == Description->Type )
    {
        jlStatus = MarshallBool( Input, Description, pNewObject );
    }
    else if (JL_DATA_TYPE_DICTIONARY == Description->Type )
    {
        // This is only called when we are processing dictionary in a list, otherwise dictionaries within
        // dictionaries are processed directly in MarshallDictionary.
        // Dictionaries within a list are always created new, they do not preserve an existing dictionary in
        // the list.
        jlStatus = JlCreateObject( JL_DATA_TYPE_DICTIONARY, pNewObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = MarshallDictionary( Input, Description->ChildStructDescription, Description->ChildStructDescriptionCount, *pNewObject );
        }
    }
    else
    {
        // Unknown data type
        jlStatus = JL_STATUS_INVALID_TYPE;
    }

    return jlStatus;
}